

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O0

nodeid_t __thiscall FirewirePort::InitNodes(FirewirePort *this)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  ostream *this_00;
  void *pvVar4;
  int numNodes;
  FirewirePort *this_local;
  
  uVar1 = raw1394_get_local_id(this->handle);
  this->baseNodeId = uVar1 & 0xffc0;
  this_00 = std::operator<<((this->super_BasePort).outStr,"FirewirePort::InitNodes: base node id = "
                           );
  pvVar4 = (void *)std::ostream::operator<<(this_00,std::hex);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,this->baseNodeId);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::dec);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  uVar3 = raw1394_get_generation(this->handle);
  (this->super_BasePort).FwBusGeneration = uVar3;
  (this->super_BasePort).newFwBusGeneration = (this->super_BasePort).FwBusGeneration;
  sVar2 = raw1394_get_nodecount(this->handle);
  return sVar2 - 1;
}

Assistant:

nodeid_t FirewirePort::InitNodes(void)
{
    // Get base node id (zero out 6 lsb)
    baseNodeId = raw1394_get_local_id(handle) & 0xFFC0;
    outStr << "FirewirePort::InitNodes: base node id = " << std::hex << baseNodeId << std::dec << std::endl;

    // Get Firewire bus generation
    FwBusGeneration = raw1394_get_generation(handle);
    newFwBusGeneration = FwBusGeneration;

    // Get total number of nodes on bus
    int numNodes = raw1394_get_nodecount(handle);
    // Subtract 1 for PC which, as bus master, is always the highest number
    return (numNodes-1);
}